

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cc
# Opt level: O3

int main(int argc,char **argv)

{
  TempFile *pTVar1;
  undefined8 __stream;
  TestingPortal *pTVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_t sVar5;
  char *pcVar6;
  int iVar7;
  string_view base_template;
  string_view base_template_00;
  string_view path;
  string_view path_00;
  string_view argv0;
  string_view argv0_00;
  Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_sampling_test_cc:187:34)>
  unlink_temps;
  TempFile heap_tmp;
  TempFile growth_tmp;
  string s;
  
  pTVar2 = tcmalloc::TestingPortal::Get();
  puVar3 = (undefined8 *)(**(code **)(*(long *)pTVar2 + 0x28))(pTVar2);
  *puVar3 = 0x80000;
  plVar4 = (long *)MallocExtension::instance();
  pcVar6 = (char *)*plVar4;
  (**(code **)(pcVar6 + 0x68))(plVar4);
  iVar7 = 8000;
  do {
    AllocateAllocate();
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  base_template._M_str = pcVar6;
  base_template._M_len = (size_t)"sampling_test.heap.XXXXXX";
  TempFile::Create((TempFile *)&unlink_temps.callback_.growth_tmp,(TempFile *)0x19,base_template);
  pTVar1 = (TempFile *)((long)&heap_tmp.path.field_2 + 8);
  base_template_00._M_str = pcVar6;
  base_template_00._M_len = (size_t)"sampling_test.growth.XXXXXX";
  TempFile::Create(pTVar1,(TempFile *)0x1b,base_template_00);
  s._M_dataplus._M_p = (pointer)0x0;
  s._M_string_length._0_1_ = 0;
  unlink_temps.callback_.heap_tmp = pTVar1;
  growth_tmp.path.field_2._8_8_ = &s._M_string_length;
  plVar4 = (long *)MallocExtension::instance();
  (**(code **)(*plVar4 + 0x40))(plVar4,(undefined1 *)((long)&growth_tmp.path.field_2 + 8));
  fwrite((void *)growth_tmp.path.field_2._8_8_,1,(size_t)s._M_dataplus._M_p,
         (FILE *)unlink_temps.callback_.growth_tmp);
  pTVar1 = unlink_temps.callback_.growth_tmp;
  unlink_temps.callback_.growth_tmp = (TempFile *)0x0;
  fclose((FILE *)pTVar1);
  s._M_dataplus._M_p = (pointer)0x0;
  *(undefined1 *)growth_tmp.path.field_2._8_8_ = 0;
  plVar4 = (long *)MallocExtension::instance();
  (**(code **)(*plVar4 + 0x48))(plVar4,(undefined1 *)((long)&growth_tmp.path.field_2 + 8));
  fwrite((void *)growth_tmp.path.field_2._8_8_,1,(size_t)s._M_dataplus._M_p,
         (FILE *)heap_tmp.path.field_2._8_8_);
  __stream = heap_tmp.path.field_2._8_8_;
  heap_tmp.path.field_2._8_8_ = 0;
  fclose((FILE *)__stream);
  pcVar6 = *argv;
  sVar5 = strlen(pcVar6);
  path._M_str = (char *)heap_tmp.f;
  path._M_len = (size_t)heap_tmp.path._M_dataplus._M_p;
  argv0._M_str = pcVar6;
  argv0._M_len = sVar5;
  VerifyWithPProf(argv0,path);
  pcVar6 = *argv;
  sVar5 = strlen(pcVar6);
  path_00._M_str = (char *)growth_tmp.f;
  path_00._M_len = (size_t)growth_tmp.path._M_dataplus._M_p;
  argv0_00._M_str = pcVar6;
  argv0_00._M_len = sVar5;
  VerifyWithPProf(argv0_00,path_00);
  if ((size_type *)growth_tmp.path.field_2._8_8_ != &s._M_string_length) {
    operator_delete((void *)growth_tmp.path.field_2._8_8_,
                    CONCAT71(s._M_string_length._1_7_,(undefined1)s._M_string_length) + 1);
  }
  unlink((char *)heap_tmp.f);
  unlink((char *)growth_tmp.f);
  TempFile::~TempFile((TempFile *)((long)&heap_tmp.path.field_2 + 8));
  TempFile::~TempFile((TempFile *)&unlink_temps.callback_.growth_tmp);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  tcmalloc::TestingPortal::Get()->GetSampleParameter() = 512 << 10;
  // Make sure allocations we sample are done on fresh thread cache, so that
  // sampling parameter update is taken into account.
  MallocExtension::instance()->MarkThreadIdle();

  for (int i = 0; i < 8000; i++) {
    AllocateAllocate();
  }

  TempFile heap_tmp = TempFile::Create("sampling_test.heap.XXXXXX");
  TempFile growth_tmp = TempFile::Create("sampling_test.growth.XXXXXX");
  tcmalloc::Cleanup unlink_temps{[&] () {
    (void)unlink(heap_tmp.path.c_str());
    (void)unlink(growth_tmp.path.c_str());
  }};

  std::string s;
  MallocExtension::instance()->GetHeapSample(&s);
  fwrite(s.data(), 1, s.size(), heap_tmp.f);
  fclose(heap_tmp.ReleaseFile());

  s.clear();
  MallocExtension::instance()->GetHeapGrowthStacks(&s);
  fwrite(s.data(), 1, s.size(), growth_tmp.f);
  fclose(growth_tmp.ReleaseFile());

  VerifyWithPProf(argv[0], heap_tmp.path);
  VerifyWithPProf(argv[0], growth_tmp.path);
}